

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

void Json::CharReaderBuilder::strictMode(Value *settings)

{
  Value *pVVar1;
  Value VStack_178;
  Value local_150;
  Value local_128;
  Value local_100;
  Value local_d8;
  Value local_b0;
  Value local_88;
  Value local_60;
  Value local_38;
  
  Value::Value(&local_38,false);
  pVVar1 = Value::operator[](settings,"allowComments");
  Value::operator=(pVVar1,&local_38);
  Value::~Value(&local_38);
  Value::Value(&local_60,true);
  pVVar1 = Value::operator[](settings,"strictRoot");
  Value::operator=(pVVar1,&local_60);
  Value::~Value(&local_60);
  Value::Value(&local_88,false);
  pVVar1 = Value::operator[](settings,"allowDroppedNullPlaceholders");
  Value::operator=(pVVar1,&local_88);
  Value::~Value(&local_88);
  Value::Value(&local_b0,false);
  pVVar1 = Value::operator[](settings,"allowNumericKeys");
  Value::operator=(pVVar1,&local_b0);
  Value::~Value(&local_b0);
  Value::Value(&local_d8,false);
  pVVar1 = Value::operator[](settings,"allowSingleQuotes");
  Value::operator=(pVVar1,&local_d8);
  Value::~Value(&local_d8);
  Value::Value(&local_100,1000);
  pVVar1 = Value::operator[](settings,"stackLimit");
  Value::operator=(pVVar1,&local_100);
  Value::~Value(&local_100);
  Value::Value(&local_128,true);
  pVVar1 = Value::operator[](settings,"failIfExtra");
  Value::operator=(pVVar1,&local_128);
  Value::~Value(&local_128);
  Value::Value(&local_150,true);
  pVVar1 = Value::operator[](settings,"rejectDupKeys");
  Value::operator=(pVVar1,&local_150);
  Value::~Value(&local_150);
  Value::Value(&VStack_178,false);
  pVVar1 = Value::operator[](settings,"allowSpecialFloats");
  Value::operator=(pVVar1,&VStack_178);
  Value::~Value(&VStack_178);
  return;
}

Assistant:

void CharReaderBuilder::strictMode(Json::Value* settings)
{
//! [CharReaderBuilderStrictMode]
  (*settings)["allowComments"] = false;
  (*settings)["strictRoot"] = true;
  (*settings)["allowDroppedNullPlaceholders"] = false;
  (*settings)["allowNumericKeys"] = false;
  (*settings)["allowSingleQuotes"] = false;
  (*settings)["stackLimit"] = 1000;
  (*settings)["failIfExtra"] = true;
  (*settings)["rejectDupKeys"] = true;
  (*settings)["allowSpecialFloats"] = false;
//! [CharReaderBuilderStrictMode]
}